

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O0

MPP_RET h264e_proc_cfg(void *ctx,MpiCmd cmd,void *param)

{
  MppEncCfgSet *cfg_00;
  MPP_RET MVar1;
  MppEncCodecCfg *codec;
  RK_U32 mb_rows;
  MppEncCfgSet *src;
  MppEncCfgImpl *impl;
  MppEncCfgSet *cfg;
  H264eCtx *p;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_local;
  void *ctx_local;
  
  p._4_4_ = MPP_OK;
  cfg_00 = *(MppEncCfgSet **)((long)ctx + 8);
  if ((h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","enter ctx %p cmd %x param %p\n","h264e_proc_cfg",ctx,(ulong)cmd,
               param);
  }
  if (cmd == MPP_ENC_SET_CFG) {
    if (*(int *)((long)param + 0x10) != 0) {
      p._4_4_ = h264e_proc_prep_cfg(&cfg_00->prep,(MppEncPrepCfg *)((long)param + 0x10));
    }
    if ((cfg_00->rc).refresh_en != 0) {
      if ((cfg_00->rc).refresh_mode == MPP_ENC_RC_INTRA_REFRESH_ROW) {
        codec._4_4_ = (int)((long)((long)((cfg_00->prep).height + 0xf) & 0xfffffffffffffff0U) / 0x10
                           );
      }
      else {
        codec._4_4_ = (int)((long)((long)((cfg_00->prep).width + 0xf) & 0xfffffffffffffff0U) / 0x10)
        ;
      }
      (cfg_00->rc).refresh_length =
           ((codec._4_4_ + (cfg_00->rc).refresh_num) - 1) / (cfg_00->rc).refresh_num;
      if ((cfg_00->rc).gop < (cfg_00->rc).refresh_length) {
        (cfg_00->rc).refresh_length = (cfg_00->rc).gop;
      }
    }
    if (*(int *)((long)param + 0x350) != 0) {
      MVar1 = h264e_proc_h264_cfg(&(cfg_00->codec).field_1.h264,
                                  (MppEncH264Cfg *)((long)param + 0x350));
      p._4_4_ = MVar1 | p._4_4_;
    }
    if (*(int *)((long)param + 0xe98) != 0) {
      MVar1 = h264e_proc_split_cfg(&cfg_00->split,(MppEncSliceSplit *)((long)param + 0xe98));
      p._4_4_ = MVar1 | p._4_4_;
    }
  }
  else if (cmd == MPP_ENC_SET_PREP_CFG) {
    p._4_4_ = h264e_proc_prep_cfg(&cfg_00->prep,(MppEncPrepCfg *)param);
  }
  else if (cmd == MPP_ENC_SET_CODEC_CFG) {
    p._4_4_ = h264e_proc_h264_cfg(&(cfg_00->codec).field_1.h264,(MppEncH264Cfg *)((long)param + 8));
  }
  else if (cmd != MPP_ENC_SET_SEI_CFG) {
    if (cmd == MPP_ENC_SET_SPLIT) {
      p._4_4_ = h264e_proc_split_cfg(&cfg_00->split,(MppEncSliceSplit *)param);
    }
    else {
      _mpp_log_l(2,"h264e_api_v2","No correspond cmd found, and can not config!",(char *)0x0);
      p._4_4_ = MPP_NOK;
    }
  }
  h264e_check_cfg(cfg_00);
  if ((h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","leave ret %d\n","h264e_proc_cfg",(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

static MPP_RET h264e_proc_cfg(void *ctx, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;
    H264eCtx *p = (H264eCtx *)ctx;
    MppEncCfgSet *cfg = p->cfg;

    h264e_dbg_func("enter ctx %p cmd %x param %p\n", ctx, cmd, param);

    switch (cmd) {
    case MPP_ENC_SET_CFG : {
        MppEncCfgImpl *impl = (MppEncCfgImpl *)param;
        MppEncCfgSet *src = &impl->cfg;

        if (src->prep.change)
            ret |= h264e_proc_prep_cfg(&cfg->prep, &src->prep);

        // TODO: rc cfg shouldn't be done here
        if (cfg->rc.refresh_en) {
            RK_U32 mb_rows;

            if (MPP_ENC_RC_INTRA_REFRESH_ROW == cfg->rc.refresh_mode)
                mb_rows = MPP_ALIGN(cfg->prep.height, 16) / 16;
            else
                mb_rows = MPP_ALIGN(cfg->prep.width, 16) / 16;

            cfg->rc.refresh_length = (mb_rows + cfg->rc.refresh_num - 1) / cfg->rc.refresh_num;
            if (cfg->rc.gop < cfg->rc.refresh_length)
                cfg->rc.refresh_length = cfg->rc.gop;
        }

        if (src->codec.h264.change)
            ret |= h264e_proc_h264_cfg(&cfg->codec.h264, &src->codec.h264);

        if (src->split.change)
            ret |= h264e_proc_split_cfg(&cfg->split, &src->split);
    } break;
    case MPP_ENC_SET_PREP_CFG : {
        ret = h264e_proc_prep_cfg(&cfg->prep, param);
    } break;
    case MPP_ENC_SET_CODEC_CFG : {
        MppEncCodecCfg *codec = (MppEncCodecCfg *)param;
        ret = h264e_proc_h264_cfg(&cfg->codec.h264, &codec->h264);
    } break;
    case MPP_ENC_SET_SEI_CFG : {
    } break;
    case MPP_ENC_SET_SPLIT : {
        ret = h264e_proc_split_cfg(&cfg->split, param);
    } break;
    default:
        mpp_err("No correspond cmd found, and can not config!");
        ret = MPP_NOK;
        break;
    }

    h264e_check_cfg(cfg);

    h264e_dbg_func("leave ret %d\n", ret);

    return ret;
}